

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::TextureMipmapTests::init(TextureMipmapTests *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  deUint32 wrapS;
  char *pcVar2;
  TestContext *pTVar3;
  Context *pCVar4;
  RenderContext *pRVar5;
  ContextInfo *renderCtxInfo;
  _func_int **__s;
  TestNode *pTVar6;
  int extraout_EAX;
  TestNode *pTVar7;
  size_t sVar8;
  Texture2DMipmapCase *pTVar9;
  long lVar10;
  long lVar11;
  Texture2DGenMipmapCase *this_00;
  Texture2DLodControlCase *pTVar12;
  TextureCubeMipmapCase *this_01;
  anon_struct_16_2_3f8b7511 *paVar13;
  TextureCubeGenMipmapCase *this_02;
  TextureCubeLodControlCase *pTVar14;
  Texture3DMipmapCase *pTVar15;
  Texture3DLodControlCase *pTVar16;
  TextureMipmapTests *pTVar17;
  bool bVar18;
  CoordType CVar19;
  TextureMipmapTests *local_228;
  anon_struct_16_2_3f8b7511 *local_220;
  anon_struct_16_3_1dd0bf0d *local_218;
  TestNode *local_210;
  TestNode *local_208;
  long *local_200;
  long local_1f0 [2];
  TestNode *local_1e0;
  TestNode *local_1d8;
  ulong local_1d0;
  anon_struct_16_2_3f8b7511 *local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  ostringstream name;
  
  local_210 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_210,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Mipmapping");
  local_208 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_208,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Mipmapping");
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"3d",
             "3D Texture Mipmapping");
  tcu::TestNode::addChild((TestNode *)this,local_210);
  tcu::TestNode::addChild((TestNode *)this,local_208);
  local_1e0 = pTVar7;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  lVar11 = 0;
  local_228 = this;
  do {
    pTVar17 = local_228;
    pTVar7 = (TestNode *)operator_new(0x70);
    local_1b8 = lVar11;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar7,
               (pTVar17->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::coordTypes[lVar11].name,init::coordTypes[lVar11].desc);
    tcu::TestNode::addChild(local_210,pTVar7);
    local_1d0 = (ulong)init::coordTypes[lVar11].type;
    lVar11 = 0;
    do {
      local_1c8 = init::minFilterModes + lVar11;
      lVar10 = 0;
      local_1b0 = lVar11;
      do {
        local_218 = (anon_struct_16_3_1dd0bf0d *)(init::wrapModes + lVar10);
        local_220 = (anon_struct_16_2_3f8b7511 *)&init::tex2DSizes[0].height;
        local_1d8 = (TestNode *)0x0;
        local_1c0 = lVar10;
        do {
          paVar13 = local_1c8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          pcVar2 = paVar13->name;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)&local_228 +
                            (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 0x80);
          }
          else {
            sVar8 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
          pcVar2 = local_218->name;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)&local_228 +
                            (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 0x80);
          }
          else {
            sVar8 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
          }
          pcVar2 = ((anon_struct_16_3_1dd0bf0d *)((long)local_220 + -0xc))->name;
          if (pcVar2 != (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
            sVar8 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
          }
          pTVar9 = (Texture2DMipmapCase *)operator_new(0x100);
          pTVar3 = (pTVar17->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pCVar4 = (pTVar17->super_TestCaseGroup).m_context;
          pRVar5 = pCVar4->m_renderCtx;
          renderCtxInfo = pCVar4->m_contextInfo;
          std::__cxx11::stringbuf::str();
          CVar19 = (CoordType)local_1d0;
          Texture2DMipmapCase::Texture2DMipmapCase
                    (pTVar9,pTVar3,pRVar5,renderCtxInfo,(char *)local_200,
                     glcts::fixed_sample_locations_values + 1,CVar19,paVar13->mode,local_218->width,
                     local_218->width,0x1908,0x1401,*(int *)((long)local_220 + -4),*(int *)local_220
                    );
          tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
          if (local_200 != local_1f0) {
            operator_delete(local_200,local_1f0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          std::ios_base::~ios_base
                    ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                    );
          pTVar17 = local_228;
          if (CVar19 != COORDTYPE_BASIC) break;
          uVar1 = (long)local_1d8 + 1;
          local_220 = (anon_struct_16_2_3f8b7511 *)((long)local_220 + 0x10);
          bVar18 = local_1d8 < 2;
          local_1d8 = (TestNode *)uVar1;
        } while (bVar18);
        lVar10 = local_1c0 + 1;
      } while (lVar10 != 3);
      lVar11 = local_1b0 + 1;
    } while (lVar11 != 4);
    lVar11 = local_1b8 + 1;
    if (lVar11 == 3) {
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (pTVar17->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bias",
                 "User-supplied bias value");
      tcu::TestNode::addChild(local_210,pTVar7);
      lVar11 = 0;
      do {
        pTVar9 = (Texture2DMipmapCase *)operator_new(0x100);
        pCVar4 = (local_228->super_TestCaseGroup).m_context;
        Texture2DMipmapCase::Texture2DMipmapCase
                  (pTVar9,(local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                          m_testCtx,pCVar4->m_renderCtx,pCVar4->m_contextInfo,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,COORDTYPE_BASIC_BIAS,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11),0x2901,0x2901,0x1908,
                   0x1401,0x40,0x40);
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      pTVar17 = local_228;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "generate","Mipmap generation tests");
      tcu::TestNode::addChild(local_210,pTVar7);
      lVar11 = 0;
      do {
        local_1d8 = (TestNode *)(init::formats + lVar11);
        lVar10 = 0;
        local_1d0 = lVar11;
        do {
          local_218 = init::tex2DSizes + lVar10;
          local_220 = (anon_struct_16_2_3f8b7511 *)0x0;
          local_1c8 = (anon_struct_16_2_3f8b7511 *)lVar10;
          do {
            pTVar6 = local_1d8;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
            __s = pTVar6->_vptr_TestNode;
            if (__s == (_func_int **)0x0) {
              std::ios::clear((int)&local_228 +
                              (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream[-3] + 0x80);
            }
            else {
              sVar8 = strlen((char *)__s);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,(char *)__s,sVar8)
              ;
            }
            pcVar2 = local_218->name;
            if (pcVar2 != (char *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
              sVar8 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
            pcVar2 = *(char **)((long)&init::genHints[0].name + (long)local_220);
            if (pcVar2 == (char *)0x0) {
              std::ios::clear((int)&local_228 +
                              (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream[-3] + 0x80);
            }
            else {
              sVar8 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
            }
            this_00 = (Texture2DGenMipmapCase *)operator_new(0xf0);
            pTVar3 = (pTVar17->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            pRVar5 = ((pTVar17->super_TestCaseGroup).m_context)->m_renderCtx;
            std::__cxx11::stringbuf::str();
            Texture2DGenMipmapCase::Texture2DGenMipmapCase
                      (this_00,pTVar3,pRVar5,(char *)local_200,
                       glcts::fixed_sample_locations_values + 1,*(deUint32 *)&pTVar6->m_testCtx,
                       *(deUint32 *)((long)&pTVar6->m_testCtx + 4),
                       *(deUint32 *)((long)&init::genHints[0].hint + (long)local_220),
                       local_218->width,local_218->height);
            tcu::TestNode::addChild(pTVar7,(TestNode *)this_00);
            if (local_200 != local_1f0) {
              operator_delete(local_200,local_1f0[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            pTVar17 = local_228;
            local_220 = (anon_struct_16_2_3f8b7511 *)((long)local_220 + 0x10);
          } while (local_220 == (anon_struct_16_2_3f8b7511 *)0x10);
          lVar10 = (long)local_1c8 + 1;
        } while (lVar10 != 3);
        lVar11 = local_1d0 + 1;
      } while (lVar11 != 8);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (pTVar17->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "min_lod","Lod control: min lod");
      tcu::TestNode::addChild(local_210,pTVar7);
      lVar11 = 0;
      do {
        pTVar12 = (Texture2DLodControlCase *)operator_new(0xe8);
        Texture2DLodControlCase::Texture2DLodControlCase
                  (pTVar12,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture2DLodControlCase_021847a0;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar12);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_lod","Lod control: max lod");
      tcu::TestNode::addChild(local_210,pTVar7);
      lVar11 = 0;
      do {
        pTVar12 = (Texture2DLodControlCase *)operator_new(0xe8);
        Texture2DLodControlCase::Texture2DLodControlCase
                  (pTVar12,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture2DLodControlCase_02184800;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar12);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "base_level","Base level");
      tcu::TestNode::addChild(local_210,pTVar7);
      lVar11 = 0;
      do {
        pTVar12 = (Texture2DLodControlCase *)operator_new(0xe8);
        Texture2DLodControlCase::Texture2DLodControlCase
                  (pTVar12,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture2DLodControlCase_02184860;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar12);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_level","Max level");
      tcu::TestNode::addChild(local_210,pTVar7);
      lVar11 = 0;
      do {
        pTVar12 = (Texture2DLodControlCase *)operator_new(0xe8);
        Texture2DLodControlCase::Texture2DLodControlCase
                  (pTVar12,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar12->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture2DLodControlCase_021848c0;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar12);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      lVar11 = 0;
      do {
        pTVar7 = (TestNode *)operator_new(0x70);
        local_220 = (anon_struct_16_2_3f8b7511 *)lVar11;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar7,
                   (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   init::cubeCoordTypes[lVar11].name,init::cubeCoordTypes[lVar11].desc);
        tcu::TestNode::addChild(local_208,pTVar7);
        lVar10 = 0;
        do {
          this_01 = (TextureCubeMipmapCase *)operator_new(0x100);
          pCVar4 = (local_228->super_TestCaseGroup).m_context;
          TextureCubeMipmapCase::TextureCubeMipmapCase
                    (this_01,(local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,pCVar4->m_renderCtx,pCVar4->m_contextInfo,
                     *(char **)((long)&init::minFilterModes[0].name + lVar10),
                     glcts::fixed_sample_locations_values + 1,init::cubeCoordTypes[lVar11].type,
                     *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar10),0x812f,0x812f,
                     0x1908,0x1401,0x40);
          tcu::TestNode::addChild(pTVar7,(TestNode *)this_01);
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x40);
        lVar11 = (long)local_220 + 1;
      } while (lVar11 != 3);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "generate","Mipmap generation tests");
      tcu::TestNode::addChild(local_208,pTVar7);
      paVar13 = (anon_struct_16_2_3f8b7511 *)0x0;
      do {
        local_220 = (anon_struct_16_2_3f8b7511 *)0x0;
        local_218 = (anon_struct_16_3_1dd0bf0d *)paVar13;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
          pcVar2 = init::formats[(long)paVar13].name;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)&local_228 +
                            (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 0x80);
          }
          else {
            sVar8 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
          pcVar2 = local_220[0x21845f].name;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)&local_228 +
                            (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream[-3] + 0x80);
          }
          else {
            sVar8 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
          }
          this_02 = (TextureCubeGenMipmapCase *)operator_new(0xe8);
          pTVar3 = (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
          pRVar5 = ((local_228->super_TestCaseGroup).m_context)->m_renderCtx;
          std::__cxx11::stringbuf::str();
          TextureCubeGenMipmapCase::TextureCubeGenMipmapCase
                    (this_02,pTVar3,pRVar5,(char *)local_200,
                     glcts::fixed_sample_locations_values + 1,init::formats[(long)paVar13].format,
                     init::formats[(long)paVar13].dataType,local_220[0x21845f].mode,0x40);
          tcu::TestNode::addChild(pTVar7,(TestNode *)this_02);
          if (local_200 != local_1f0) {
            operator_delete(local_200,local_1f0[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
          std::ios_base::~ios_base
                    ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                    );
          local_220 = local_220 + 1;
        } while (local_220 == (anon_struct_16_2_3f8b7511 *)0x10);
        paVar13 = (anon_struct_16_2_3f8b7511 *)((long)&local_218->name + 1);
      } while (paVar13 != (anon_struct_16_2_3f8b7511 *)0x8);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "min_lod","Lod control: min lod");
      tcu::TestNode::addChild(local_208,pTVar7);
      lVar11 = 0;
      do {
        pTVar14 = (TextureCubeLodControlCase *)operator_new(0xe0);
        TextureCubeLodControlCase::TextureCubeLodControlCase
                  (pTVar14,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar14->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureCubeLodControlCase_02184920;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar14);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_lod","Lod control: max lod");
      tcu::TestNode::addChild(local_208,pTVar7);
      lVar11 = 0;
      do {
        pTVar14 = (TextureCubeLodControlCase *)operator_new(0xe0);
        TextureCubeLodControlCase::TextureCubeLodControlCase
                  (pTVar14,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar14->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureCubeLodControlCase_02184980;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar14);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "base_level","Base level");
      tcu::TestNode::addChild(local_208,pTVar7);
      lVar11 = 0;
      do {
        pTVar14 = (TextureCubeLodControlCase *)operator_new(0xe0);
        TextureCubeLodControlCase::TextureCubeLodControlCase
                  (pTVar14,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar14->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureCubeLodControlCase_021849e0;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar14);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_level","Max level");
      tcu::TestNode::addChild(local_208,pTVar7);
      lVar11 = 0;
      do {
        pTVar14 = (TextureCubeLodControlCase *)operator_new(0xe0);
        TextureCubeLodControlCase::TextureCubeLodControlCase
                  (pTVar14,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar14->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__TextureCubeLodControlCase_02184a40;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar14);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      lVar11 = 0;
      do {
        pTVar17 = local_228;
        pTVar7 = (TestNode *)operator_new(0x70);
        local_1c0 = lVar11;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar7,
                   (pTVar17->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   init::coordTypes[lVar11].name,init::coordTypes[lVar11].desc);
        local_1d8 = pTVar7;
        tcu::TestNode::addChild(local_1e0,pTVar7);
        CVar19 = init::coordTypes[lVar11].type;
        lVar11 = 0;
        do {
          local_218 = (anon_struct_16_3_1dd0bf0d *)(init::minFilterModes + lVar11);
          lVar10 = 0;
          local_1d0 = lVar11;
          do {
            local_220 = init::wrapModes + lVar10;
            lVar11 = 0;
            local_1c8 = (anon_struct_16_2_3f8b7511 *)lVar10;
            do {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
              pcVar2 = local_218->name;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)&local_228 +
                                (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 0x80);
              }
              else {
                sVar8 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
              pcVar2 = local_220->name;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)&local_228 +
                                (int)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                     _vptr_basic_ostream[-3] + 0x80);
              }
              else {
                sVar8 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
              }
              pcVar2 = *(char **)((long)&init::tex3DSizes[0].name + lVar11);
              if (pcVar2 != (char *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"_",1);
                sVar8 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,pcVar2,sVar8);
              }
              pTVar15 = (Texture3DMipmapCase *)operator_new(0x100);
              pCVar4 = (pTVar17->super_TestCaseGroup).m_context;
              std::__cxx11::stringbuf::str();
              wrapS = local_220->mode;
              Texture3DMipmapCase::Texture3DMipmapCase
                        (pTVar15,pCVar4,(char *)local_200,glcts::fixed_sample_locations_values + 1,
                         CVar19,local_218->width,wrapS,wrapS,wrapS,0x8058,
                         *(int *)((long)&init::tex3DSizes[0].width + lVar11),
                         *(int *)((long)&init::tex3DSizes[0].height + lVar11),
                         *(int *)((long)&init::tex3DSizes[0].depth + lVar11));
              tcu::TestNode::addChild(local_1d8,(TestNode *)pTVar15);
              if (local_200 != local_1f0) {
                operator_delete(local_200,local_1f0[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
              std::ios_base::~ios_base
                        ((ios_base *)
                         &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
              pTVar17 = local_228;
            } while ((CVar19 == COORDTYPE_BASIC) &&
                    (bVar18 = lVar11 == 0, lVar11 = lVar11 + 0x18, bVar18));
            lVar10 = (long)local_1c8 + 1;
          } while (lVar10 != 3);
          lVar11 = local_1d0 + 1;
        } while (lVar11 != 4);
        lVar11 = local_1c0 + 1;
      } while (lVar11 != 3);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (pTVar17->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"bias",
                 "User-supplied bias value");
      tcu::TestNode::addChild(local_1e0,pTVar7);
      lVar11 = 0;
      do {
        pTVar15 = (Texture3DMipmapCase *)operator_new(0x100);
        Texture3DMipmapCase::Texture3DMipmapCase
                  (pTVar15,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,COORDTYPE_BASIC_BIAS,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11),0x2901,0x2901,0x2901,
                   0x8058,0x20,0x20,0x20);
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar15);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "min_lod","Lod control: min lod");
      tcu::TestNode::addChild(local_1e0,pTVar7);
      lVar11 = 0;
      do {
        pTVar16 = (Texture3DLodControlCase *)operator_new(0xe8);
        Texture3DLodControlCase::Texture3DLodControlCase
                  (pTVar16,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture3DLodControlCase_02184aa0;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar16);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_lod","Lod control: max lod");
      tcu::TestNode::addChild(local_1e0,pTVar7);
      lVar11 = 0;
      do {
        pTVar16 = (Texture3DLodControlCase *)operator_new(0xe8);
        Texture3DLodControlCase::Texture3DLodControlCase
                  (pTVar16,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture3DLodControlCase_02184b00;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar16);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "base_level","Base level");
      tcu::TestNode::addChild(local_1e0,pTVar7);
      lVar11 = 0;
      do {
        pTVar16 = (Texture3DLodControlCase *)operator_new(0xe8);
        Texture3DLodControlCase::Texture3DLodControlCase
                  (pTVar16,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture3DLodControlCase_02184b60;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar16);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (local_228->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "max_level","Max level");
      tcu::TestNode::addChild(local_1e0,pTVar7);
      lVar11 = 0;
      do {
        pTVar16 = (Texture3DLodControlCase *)operator_new(0xe8);
        Texture3DLodControlCase::Texture3DLodControlCase
                  (pTVar16,(local_228->super_TestCaseGroup).m_context,
                   *(char **)((long)&init::minFilterModes[0].name + lVar11),
                   glcts::fixed_sample_locations_values + 1,
                   *(deUint32 *)((long)&init::minFilterModes[0].mode + lVar11));
        (pTVar16->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__Texture3DLodControlCase_02184bc0;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar16);
        lVar11 = lVar11 + 0x10;
      } while (lVar11 != 0x40);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void TextureMipmapTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Mipmapping");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Mipmapping");
	tcu::TestCaseGroup*	group3D		= new tcu::TestCaseGroup(m_testCtx, "3d",	"3D Texture Mipmapping");
	addChild(group2D);
	addChild(groupCube);
	addChild(group3D);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	static const struct
	{
		const char*		name;
		deUint32		hint;
	} genHints[] =
	{
		{ "fastest",	GL_FASTEST },
		{ "nicest",		GL_NICEST }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "npot",		63, 57 },
		{ "non_square",	32, 64 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
		int				depth;
	} tex3DSizes[] =
	{
		{ DE_NULL,		32, 32, 32 }, // Default.
		{ "npot",		33, 29, 27 }
	};

	const int cubeMapSize = 64;

	static const struct
	{
		CoordType		type;
		const char*		name;
		const char*		desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// 2D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group2D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add non_square variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					coordTypeGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA, GL_UNSIGNED_BYTE,
																	 tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group2D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture2DMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT,
														GL_RGBA, GL_UNSIGNED_BYTE,
														tex2DSizes[0].width, tex2DSizes[0].height));
	}

	// 2D mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		group2D->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int size = 0; size < DE_LENGTH_OF_ARRAY(tex2DSizes); size++)
			{
				for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
				{
					std::ostringstream name;
					name << formats[format].name;

					if (tex2DSizes[size].name)
						name << "_" << tex2DSizes[size].name;

					name << "_" << genHints[hint].name;

					genMipmapGroup->addChild(new Texture2DGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "",
																		formats[format].format, formats[format].dataType, genHints[hint].hint,
																		tex2DSizes[size].width, tex2DSizes[size].height));
				}
			}
		}
	}

	// 2D LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		group2D->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new Texture2DMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		group2D->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new Texture2DMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		group2D->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new Texture2DBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		group2D->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new Texture2DMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}

	// Cubemap cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc);
		groupCube->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			coordTypeGroup->addChild(new TextureCubeMipmapCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															   minFilterModes[minFilter].name, "",
															   cubeCoordTypes[coordType].type,
															   minFilterModes[minFilter].mode,
															   GL_CLAMP_TO_EDGE,
															   GL_CLAMP_TO_EDGE,
															   GL_RGBA, GL_UNSIGNED_BYTE, cubeMapSize));
		}
	}

	// Cubemap mipmap generation variants.
	{
		tcu::TestCaseGroup* genMipmapGroup = new tcu::TestCaseGroup(m_testCtx, "generate", "Mipmap generation tests");
		groupCube->addChild(genMipmapGroup);

		for (int format = 0; format < DE_LENGTH_OF_ARRAY(formats); format++)
		{
			for (int hint = 0; hint < DE_LENGTH_OF_ARRAY(genHints); hint++)
			{
				std::ostringstream name;
				name << formats[format].name
					 << "_" << genHints[hint].name;

				genMipmapGroup->addChild(new TextureCubeGenMipmapCase(m_testCtx, m_context.getRenderContext(), name.str().c_str(), "", formats[format].format, formats[format].dataType, genHints[hint].hint, cubeMapSize));
			}
		}
	}

	// Cubemap LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		groupCube->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new TextureCubeMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		groupCube->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new TextureCubeMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		groupCube->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new TextureCubeBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		groupCube->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new TextureCubeMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}

	// 3D cases.
	for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
	{
		tcu::TestCaseGroup* coordTypeGroup = new tcu::TestCaseGroup(m_testCtx, coordTypes[coordType].name, coordTypes[coordType].desc);
		group3D->addChild(coordTypeGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
		{
			for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
			{
				// Add other size variants to basic cases only.
				int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex3DSizes) : 1;

				for (int size = 0; size < sizeEnd; size++)
				{
					std::ostringstream name;
					name << minFilterModes[minFilter].name
						 << "_" << wrapModes[wrapMode].name;

					if (tex3DSizes[size].name)
						name << "_" << tex3DSizes[size].name;

					coordTypeGroup->addChild(new Texture3DMipmapCase(m_context,
																	 name.str().c_str(), "",
																	 coordTypes[coordType].type,
																	 minFilterModes[minFilter].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 wrapModes[wrapMode].mode,
																	 GL_RGBA8,
																	 tex3DSizes[size].width, tex3DSizes[size].height, tex3DSizes[size].depth));
				}
			}
		}
	}

	// 3D bias variants.
	{
		tcu::TestCaseGroup* biasGroup = new tcu::TestCaseGroup(m_testCtx, "bias", "User-supplied bias value");
		group3D->addChild(biasGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			biasGroup->addChild(new Texture3DMipmapCase(m_context,
														minFilterModes[minFilter].name, "",
														COORDTYPE_BASIC_BIAS,
														minFilterModes[minFilter].mode,
														GL_REPEAT, GL_REPEAT, GL_REPEAT,
														GL_RGBA8,
														tex3DSizes[0].width, tex3DSizes[0].height, tex3DSizes[0].depth));
	}

	// 3D LOD controls.
	{
		// MIN_LOD
		tcu::TestCaseGroup* minLodGroup = new tcu::TestCaseGroup(m_testCtx, "min_lod", "Lod control: min lod");
		group3D->addChild(minLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			minLodGroup->addChild(new Texture3DMinLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LOD
		tcu::TestCaseGroup* maxLodGroup = new tcu::TestCaseGroup(m_testCtx, "max_lod", "Lod control: max lod");
		group3D->addChild(maxLodGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLodGroup->addChild(new Texture3DMaxLodCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// BASE_LEVEL
		tcu::TestCaseGroup* baseLevelGroup = new tcu::TestCaseGroup(m_testCtx, "base_level", "Base level");
		group3D->addChild(baseLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			baseLevelGroup->addChild(new Texture3DBaseLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));

		// MAX_LEVEL
		tcu::TestCaseGroup* maxLevelGroup = new tcu::TestCaseGroup(m_testCtx, "max_level", "Max level");
		group3D->addChild(maxLevelGroup);

		for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			maxLevelGroup->addChild(new Texture3DMaxLevelCase(m_context, minFilterModes[minFilter].name, "", minFilterModes[minFilter].mode));
	}
}